

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

void __thiscall
IntBounds::SetBound<false>
          (IntBounds *this,ValueNumber myValueNumber,Value *baseValue,int offset,
          bool wasEstablishedExplicitly)

{
  ValueInfo *this_00;
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  IntBoundedValueInfo *pIVar7;
  EntryType *pEVar8;
  undefined3 in_register_00000081;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  undefined1 local_90 [8];
  ValueRelativeOffset bound;
  undefined1 auStack_68 [8];
  ValueRelativeOffset *existingOppositeBound;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_58;
  int32 local_50;
  ValueNumber local_4c;
  int constantBoundBase;
  undefined4 uStack_44;
  ValueRelativeOffset *existingBound;
  ValueRelativeOffset *existingBound_1;
  
  existingBound_1._4_4_ = CONCAT31(in_register_00000081,wasEstablishedExplicitly);
  existingBound_1._0_4_ = myValueNumber;
  if (baseValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xb0,"(baseValue)","baseValue");
    if (!bVar2) goto LAB_00515f17;
    *puVar6 = 0;
  }
  if (baseValue->valueNumber == (ValueNumber)existingBound_1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xb1,"(baseValue->GetValueNumber() != myValueNumber)",
                       "baseValue->GetValueNumber() != myValueNumber");
    if (!bVar2) goto LAB_00515f17;
    *puVar6 = 0;
  }
  this_00 = baseValue->valueInfo;
  local_50 = -0x33333334;
  bVar2 = ValueInfo::TryGetIntConstantUpperBound(this_00,&local_50,true);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xba,"(success)","success");
    if (!bVar2) {
LAB_00515f17:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar2 = ValueInfo::HasIntConstantValue(this_00,false);
  SetBound<false>(this,local_50,offset,(bool)(bVar2 & existingBound_1._4_1_));
  if (!bVar2) {
    bVar2 = ValueInfo::IsIntBounded(this_00);
    pBVar9 = &(this->relativeUpperBounds).
              super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    if (bVar2) {
      local_58 = &(this->relativeUpperBounds).
                  super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ;
      pIVar7 = ValueInfo::AsIntBounded(this_00);
      JsUtil::
      BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::EntryIterator((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_90,&pIVar7->bounds->relativeUpperBounds);
      while (bVar2 = JsUtil::
                     BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ::
                     EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     ::IsValid((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                                *)local_90), pBVar9 = local_58, bVar2) {
        pEVar8 = JsUtil::
                 BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_90);
        auStack_68 = (undefined1  [8])
                     (pEVar8->
                     super_DefaultHashedEntry<unsigned_int,_ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                     ).super_ImplicitKeyValueEntry<unsigned_int,_ValueRelativeOffset>.
                     super_ValueEntry<ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ValueEntryData<ValueRelativeOffset>_>
                     .super_ValueEntryData<ValueRelativeOffset>.value.baseValue;
        existingOppositeBound =
             *(ValueRelativeOffset **)
              &(pEVar8->
               super_DefaultHashedEntry<unsigned_int,_ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               ).super_ImplicitKeyValueEntry<unsigned_int,_ValueRelativeOffset>.
               super_ValueEntry<ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ValueEntryData<ValueRelativeOffset>_>
               .super_ValueEntryData<ValueRelativeOffset>.value.offset;
        VVar3 = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)auStack_68);
        if ((VVar3 != (ValueNumber)existingBound_1) &&
           (bVar2 = ValueRelativeOffset::Add((ValueRelativeOffset *)auStack_68,offset), bVar2)) {
          existingBound._0_4_ =
               ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)auStack_68);
          bVar2 = JsUtil::
                  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::TryGetReference<unsigned_int>
                            (&(this->relativeLowerBounds).
                              super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             ,(uint *)&existingBound,(ValueRelativeOffset **)&constantBoundBase);
          if (bVar2) {
            iVar4 = ValueRelativeOffset::Offset((ValueRelativeOffset *)auStack_68);
            iVar5 = ValueRelativeOffset::Offset
                              ((ValueRelativeOffset *)CONCAT44(uStack_44,constantBoundBase));
            if (iVar4 < iVar5) goto LAB_00515e6d;
          }
          local_4c = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)auStack_68);
          pBVar9 = local_58;
          bVar2 = JsUtil::
                  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::TryGetReference<unsigned_int>(local_58,&local_4c,&existingBound);
          if (bVar2) {
            ValueRelativeOffset::Merge<false,true>
                      ((ValueRelativeOffset *)
                       CONCAT44(existingBound._4_4_,(ValueNumber)existingBound),
                       (ValueRelativeOffset *)auStack_68);
          }
          else {
            JsUtil::
            BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Add((BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)pBVar9,(ValueRelativeOffset *)auStack_68);
          }
        }
LAB_00515e6d:
        JsUtil::
        BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    *)local_90);
      }
    }
    ValueRelativeOffset::ValueRelativeOffset
              ((ValueRelativeOffset *)local_90,baseValue,offset,(bool)existingBound_1._4_1_);
    constantBoundBase = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)local_90);
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (&(this->relativeLowerBounds).
                        super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ,(uint *)&constantBoundBase,(ValueRelativeOffset **)auStack_68);
    if ((!bVar2) ||
       (iVar4 = ValueRelativeOffset::Offset((ValueRelativeOffset *)auStack_68), iVar4 <= offset)) {
      existingBound._0_4_ = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)local_90);
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<unsigned_int>
                        (pBVar9,(uint *)&existingBound,(ValueRelativeOffset **)&constantBoundBase);
      if (bVar2) {
        ValueRelativeOffset::Merge<false,true>
                  ((ValueRelativeOffset *)CONCAT44(uStack_44,constantBoundBase),
                   (ValueRelativeOffset *)local_90);
      }
      else {
        JsUtil::
        BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add((BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)pBVar9,(ValueRelativeOffset *)local_90);
      }
    }
  }
  return;
}

Assistant:

void IntBounds::SetBound(
    const ValueNumber myValueNumber,
    const Value *const baseValue,
    const int offset,
    const bool wasEstablishedExplicitly)
{
    Assert(baseValue);
    Assert(baseValue->GetValueNumber() != myValueNumber);

    // Aggressively merge the constant lower or upper bound of the base value, adjusted by the offset
    ValueInfo const * const baseValueInfo = baseValue->GetValueInfo();
    int constantBoundBase = 0xCCCCCCCC;
    const bool success =
        Lower
            ? baseValueInfo->TryGetIntConstantLowerBound(&constantBoundBase, true)
            : baseValueInfo->TryGetIntConstantUpperBound(&constantBoundBase, true);
    Assert(success);
    const bool isBoundConstant = baseValueInfo->HasIntConstantValue();
    SetBound<Lower>(constantBoundBase, offset, wasEstablishedExplicitly && isBoundConstant);

    if(isBoundConstant)
        return;

    // If the base value has relative bounds, pull in the lower or upper bounds adjusted by the offset
    RelativeIntBoundSet &boundSet = Lower ? relativeLowerBounds : relativeUpperBounds;
    const RelativeIntBoundSet &oppositeBoundSet = Lower ? relativeUpperBounds : relativeLowerBounds;
    if(baseValueInfo->IsIntBounded())
    {
        const IntBounds *const baseValueBounds = baseValueInfo->AsIntBounded()->Bounds();
        const RelativeIntBoundSet &baseValueBoundSet =
            Lower ? baseValueBounds->relativeLowerBounds : baseValueBounds->relativeUpperBounds;
        for(auto it = baseValueBoundSet.GetIterator(); it.IsValid(); it.MoveNext())
        {
            ValueRelativeOffset bound(it.CurrentValue());
            if(bound.BaseValueNumber() == myValueNumber || !bound.Add(offset))
                continue;
            const ValueRelativeOffset *existingOppositeBound;
            if(oppositeBoundSet.TryGetReference(bound.BaseValueNumber(), &existingOppositeBound) &&
                (Lower ? bound.Offset() > existingOppositeBound->Offset() : bound.Offset() < existingOppositeBound->Offset()))
            {
                // This bound contradicts the existing opposite bound on the same base value number:
                //     - Setting a lower bound (base + offset) when (base + offset2) is an upper bound and (offset > offset2)
                //     - Setting an upper bound (base + offset) when (base + offset2) is a lower bound and (offset < offset2)
                continue;
            }
            ValueRelativeOffset *existingBound;
            if(boundSet.TryGetReference(bound.BaseValueNumber(), &existingBound))
                existingBound->Merge<Lower, true>(bound);
            else
                boundSet.Add(bound);
        }
    }

    // Set the base value as a relative bound
    const ValueRelativeOffset bound(baseValue, offset, wasEstablishedExplicitly);
    const ValueRelativeOffset *existingOppositeBound;
    if(oppositeBoundSet.TryGetReference(bound.BaseValueNumber(), &existingOppositeBound) &&
        (Lower ? offset > existingOppositeBound->Offset() : offset < existingOppositeBound->Offset()))
    {
        // This bound contradicts the existing opposite bound on the same base value number:
        //     - Setting a lower bound (base + offset) when (base + offset2) is an upper bound and (offset > offset2)
        //     - Setting an upper bound (base + offset) when (base + offset2) is a lower bound and (offset < offset2)
        return;
    }
    ValueRelativeOffset *existingBound;
    if(boundSet.TryGetReference(bound.BaseValueNumber(), &existingBound))
        existingBound->Merge<Lower, true>(bound);
    else
        boundSet.Add(bound);
}